

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall btDbvtBroadphase::collide(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  btBroadphaseProxy *pbVar1;
  btBroadphaseProxy *pbVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  btDbvtAabbMm *b;
  btBroadphasePair *pbVar7;
  undefined8 in_RSI;
  long in_RDI;
  ICollide *in_stack_00000018;
  btDbvtNode *in_stack_00000020;
  btDbvtNode *in_stack_00000028;
  btDbvt *in_stack_00000030;
  btDbvtProxy *pb;
  btDbvtProxy *pa;
  btBroadphasePair *p;
  int i;
  int ni;
  btBroadphasePairArray *pairs;
  btDbvtTreeCollider collider_1;
  btDbvtVolume curAabb;
  btDbvtProxy *next;
  btDbvtTreeCollider collider;
  btDbvtProxy *current;
  int count;
  btDbvtBroadphase *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  btDbvtVolume *in_stack_ffffffffffffff18;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  btDbvtNode *in_stack_ffffffffffffff30;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  btAlignedObjectArray<btBroadphasePair> *local_98;
  btDbvtProxy *local_48;
  btDbvtProxy *local_28;
  int local_1c [3];
  undefined8 local_10;
  
  local_10 = in_RSI;
  btDbvt::optimizeIncremental
            ((btDbvt *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  if (*(int *)(in_RDI + 0x100) != 0) {
    local_1c[2] = (*(int *)(in_RDI + 0x7c) * *(int *)(in_RDI + 0xf0)) / 100 + 1;
    btDbvt::optimizeIncremental
              ((btDbvt *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    local_1c[1] = 0;
    local_1c[0] = *(int *)(in_RDI + 0x100) - local_1c[2];
    piVar6 = btMax<int>(local_1c + 1,local_1c);
    *(int *)(in_RDI + 0x100) = *piVar6;
  }
  *(int *)(in_RDI + 0xec) = (*(int *)(in_RDI + 0xec) + 1) % 2;
  local_28 = *(btDbvtProxy **)(in_RDI + 200 + (long)*(int *)(in_RDI + 0xec) * 8);
  if (local_28 != (btDbvtProxy *)0x0) {
    btDbvtTreeCollider::btDbvtTreeCollider
              ((btDbvtTreeCollider *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    do {
      local_48 = local_28->links[1];
      listremove<btDbvtProxy>(local_28,(btDbvtProxy **)(in_RDI + 200 + (long)local_28->stage * 8));
      listappend<btDbvtProxy>(local_28,(btDbvtProxy **)(in_RDI + 0xd8));
      btDbvt::remove((btDbvt *)(in_RDI + 8),(char *)local_28->leaf);
      btDbvtAabbMm::FromMM
                ((btVector3 *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 &in_stack_ffffffffffffff18->mi);
      in_stack_ffffffffffffff30 =
           btDbvt::insert((btDbvt *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18,
                          (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_28->leaf = in_stack_ffffffffffffff30;
      local_28->stage = 2;
      local_28 = local_48;
    } while (local_48 != (btDbvtProxy *)0x0);
    *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(in_RDI + 0x7c);
    *(undefined1 *)(in_RDI + 0x11e) = 1;
    btDbvtTreeCollider::~btDbvtTreeCollider((btDbvtTreeCollider *)0x161c36);
  }
  btDbvtTreeCollider::btDbvtTreeCollider
            ((btDbvtTreeCollider *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
  if ((*(byte *)(in_RDI + 0x11d) & 1) != 0) {
    btDbvt::collideTTpersistentStack
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  if ((*(byte *)(in_RDI + 0x11d) & 1) != 0) {
    btDbvt::collideTTpersistentStack
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  btDbvtTreeCollider::~btDbvtTreeCollider((btDbvtTreeCollider *)0x161cf9);
  if ((*(byte *)(in_RDI + 0x11e) & 1) != 0) {
    local_98 = (btAlignedObjectArray<btBroadphasePair> *)
               (**(code **)(**(long **)(in_RDI + 0xe0) + 0x38))();
    iVar4 = btAlignedObjectArray<btBroadphasePair>::size(local_98);
    if (0 < iVar4) {
      local_a0 = btAlignedObjectArray<btBroadphasePair>::size(local_98);
      b = (btDbvtAabbMm *)(in_RDI + 0xfc);
      iVar4 = btAlignedObjectArray<btBroadphasePair>::size(local_98);
      local_a4 = (iVar4 * *(int *)(in_RDI + 0xf8)) / 100;
      piVar6 = btMax<int>((int *)b,&local_a4);
      piVar6 = btMin<int>(&local_a0,piVar6);
      local_9c = *piVar6;
      for (local_a8 = 0; local_a8 < local_9c; local_a8 = local_a8 + 1) {
        iVar4 = *(int *)(in_RDI + 0x114) + local_a8;
        this_00 = local_98;
        iVar5 = btAlignedObjectArray<btBroadphasePair>::size(local_98);
        pbVar7 = btAlignedObjectArray<btBroadphasePair>::operator[](this_00,iVar4 % iVar5);
        pbVar1 = pbVar7->m_pProxy0;
        pbVar2 = pbVar7->m_pProxy1;
        bVar3 = Intersect(&in_stack_ffffffffffffff30->volume,b);
        if (!bVar3) {
          (**(code **)(**(long **)(in_RDI + 0xe0) + 0x18))
                    (*(long **)(in_RDI + 0xe0),pbVar1,pbVar2,local_10);
          local_9c = local_9c + -1;
          local_a8 = local_a8 + -1;
        }
      }
      iVar4 = btAlignedObjectArray<btBroadphasePair>::size(local_98);
      if (iVar4 < 1) {
        *(undefined4 *)(in_RDI + 0x114) = 0;
      }
      else {
        iVar4 = *(int *)(in_RDI + 0x114) + local_9c;
        iVar5 = btAlignedObjectArray<btBroadphasePair>::size(local_98);
        *(int *)(in_RDI + 0x114) = iVar4 % iVar5;
      }
    }
  }
  *(int *)(in_RDI + 0x110) = *(int *)(in_RDI + 0x110) + 1;
  *(undefined4 *)(in_RDI + 0xfc) = 1;
  *(undefined1 *)(in_RDI + 0x11e) = 0;
  if (*(int *)(in_RDI + 0x104) == 0) {
    *(undefined4 *)(in_RDI + 0x10c) = 0;
  }
  else {
    *(float *)(in_RDI + 0x10c) = (float)*(uint *)(in_RDI + 0x108) / (float)*(uint *)(in_RDI + 0x104)
    ;
  }
  *(uint *)(in_RDI + 0x108) = *(uint *)(in_RDI + 0x108) >> 1;
  *(uint *)(in_RDI + 0x104) = *(uint *)(in_RDI + 0x104) >> 1;
  return;
}

Assistant:

void							btDbvtBroadphase::collide(btDispatcher* dispatcher)
{
	/*printf("---------------------------------------------------------\n");
	printf("m_sets[0].m_leaves=%d\n",m_sets[0].m_leaves);
	printf("m_sets[1].m_leaves=%d\n",m_sets[1].m_leaves);
	printf("numPairs = %d\n",getOverlappingPairCache()->getNumOverlappingPairs());
	{
		int i;
		for (i=0;i<getOverlappingPairCache()->getNumOverlappingPairs();i++)
		{
			printf("pair[%d]=(%d,%d),",i,getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy0->getUid(),
				getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy1->getUid());
		}
		printf("\n");
	}
*/



	SPC(m_profiling.m_total);
	/* optimize				*/ 
	m_sets[0].optimizeIncremental(1+(m_sets[0].m_leaves*m_dupdates)/100);
	if(m_fixedleft)
	{
		const int count=1+(m_sets[1].m_leaves*m_fupdates)/100;
		m_sets[1].optimizeIncremental(1+(m_sets[1].m_leaves*m_fupdates)/100);
		m_fixedleft=btMax<int>(0,m_fixedleft-count);
	}
	/* dynamic -> fixed set	*/ 
	m_stageCurrent=(m_stageCurrent+1)%STAGECOUNT;
	btDbvtProxy*	current=m_stageRoots[m_stageCurrent];
	if(current)
	{
		btDbvtTreeCollider	collider(this);
		do	{
			btDbvtProxy*	next=current->links[1];
			listremove(current,m_stageRoots[current->stage]);
			listappend(current,m_stageRoots[STAGECOUNT]);
#if DBVT_BP_ACCURATESLEEPING
			m_paircache->removeOverlappingPairsContainingProxy(current,dispatcher);
			collider.proxy=current;
			btDbvt::collideTV(m_sets[0].m_root,current->aabb,collider);
			btDbvt::collideTV(m_sets[1].m_root,current->aabb,collider);
#endif
			m_sets[0].remove(current->leaf);
			ATTRIBUTE_ALIGNED16(btDbvtVolume)	curAabb=btDbvtVolume::FromMM(current->m_aabbMin,current->m_aabbMax);
			current->leaf	=	m_sets[1].insert(curAabb,current);
			current->stage	=	STAGECOUNT;	
			current			=	next;
		} while(current);
		m_fixedleft=m_sets[1].m_leaves;
		m_needcleanup=true;
	}
	/* collide dynamics		*/ 
	{
		btDbvtTreeCollider	collider(this);
		if(m_deferedcollide)
		{
			SPC(m_profiling.m_fdcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root,m_sets[1].m_root,collider);
		}
		if(m_deferedcollide)
		{
			SPC(m_profiling.m_ddcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root,m_sets[0].m_root,collider);
		}
	}
	/* clean up				*/ 
	if(m_needcleanup)
	{
		SPC(m_profiling.m_cleanup);
		btBroadphasePairArray&	pairs=m_paircache->getOverlappingPairArray();
		if(pairs.size()>0)
		{

			int			ni=btMin(pairs.size(),btMax<int>(m_newpairs,(pairs.size()*m_cupdates)/100));
			for(int i=0;i<ni;++i)
			{
				btBroadphasePair&	p=pairs[(m_cid+i)%pairs.size()];
				btDbvtProxy*		pa=(btDbvtProxy*)p.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)p.m_pProxy1;
				if(!Intersect(pa->leaf->volume,pb->leaf->volume))
				{
#if DBVT_BP_SORTPAIRS
					if(pa->m_uniqueId>pb->m_uniqueId) 
						btSwap(pa,pb);
#endif
					m_paircache->removeOverlappingPair(pa,pb,dispatcher);
					--ni;--i;
				}
			}
			if(pairs.size()>0) m_cid=(m_cid+ni)%pairs.size(); else m_cid=0;
		}
	}
	++m_pid;
	m_newpairs=1;
	m_needcleanup=false;
	if(m_updates_call>0)
	{ m_updates_ratio=m_updates_done/(btScalar)m_updates_call; }
	else
	{ m_updates_ratio=0; }
	m_updates_done/=2;
	m_updates_call/=2;
}